

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O0

void __thiscall
deci::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,state_type s,symbol_type *that)

{
  symbol_kind_type sVar1;
  symbol_type *that_local;
  state_type s_local;
  stack_symbol_type *this_local;
  
  basic_symbol<deci::parser_t::by_state>::basic_symbol
            (&this->super_basic_symbol<deci::parser_t::by_state>,s,
             &(that->super_basic_symbol<deci::parser_t::by_kind>).location);
  sVar1 = by_kind::kind((by_kind *)that);
  switch(sVar1) {
  case S_NUMBER:
    value_type::move<double>
              (&(this->super_basic_symbol<deci::parser_t::by_state>).value,
               &(that->super_basic_symbol<deci::parser_t::by_kind>).value);
    break;
  case S_IDENTIFIER:
  case S_CMP_OPERATOR:
    value_type::move<std::__cxx11::string>
              (&(this->super_basic_symbol<deci::parser_t::by_state>).value,
               &(that->super_basic_symbol<deci::parser_t::by_kind>).value);
    break;
  default:
    break;
  case S_42_argument_list_:
  case S_argument_list:
    value_type::move<deci::ast_arg_list_t*>
              (&(this->super_basic_symbol<deci::parser_t::by_state>).value,
               &(that->super_basic_symbol<deci::parser_t::by_kind>).value);
    break;
  case S_43_statement_list_:
  case S_statement_list:
    value_type::move<deci::ast_t*>
              (&(this->super_basic_symbol<deci::parser_t::by_state>).value,
               &(that->super_basic_symbol<deci::parser_t::by_kind>).value);
    break;
  case S_statement:
  case S_expression_statement:
  case S_expression:
  case S_assign_expr:
  case S_or_expr:
  case S_xor_expr:
  case S_and_expr:
  case S_eql_expr:
  case S_cmp_expr:
  case S_add_expr:
  case S_mul_expr:
  case S_pow_expr:
  case S_unary_expr:
  case S_postfix_expr:
  case S_primary_expr:
  case S_if_statement:
  case S_for_statement:
  case S_while_statement:
  case S_repeat_statement:
    value_type::move<deci::ast_item_t*>
              (&(this->super_basic_symbol<deci::parser_t::by_state>).value,
               &(that->super_basic_symbol<deci::parser_t::by_kind>).value);
    break;
  case S_exit_statement:
    value_type::move<deci::ast_exit_t*>
              (&(this->super_basic_symbol<deci::parser_t::by_state>).value,
               &(that->super_basic_symbol<deci::parser_t::by_kind>).value);
  }
  (that->super_basic_symbol<deci::parser_t::by_kind>).super_by_kind.kind_ = S_YYEMPTY;
  return;
}

Assistant:

parser_t ::stack_symbol_type::stack_symbol_type (state_type s, YY_MOVE_REF (symbol_type) that)
    : super_type (s, YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_42_argument_list_: // "argument list"
      case symbol_kind::S_argument_list: // argument_list
        value.move< ast_arg_list_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_exit_statement: // exit_statement
        value.move< ast_exit_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_statement: // statement
      case symbol_kind::S_expression_statement: // expression_statement
      case symbol_kind::S_expression: // expression
      case symbol_kind::S_assign_expr: // assign_expr
      case symbol_kind::S_or_expr: // or_expr
      case symbol_kind::S_xor_expr: // xor_expr
      case symbol_kind::S_and_expr: // and_expr
      case symbol_kind::S_eql_expr: // eql_expr
      case symbol_kind::S_cmp_expr: // cmp_expr
      case symbol_kind::S_add_expr: // add_expr
      case symbol_kind::S_mul_expr: // mul_expr
      case symbol_kind::S_pow_expr: // pow_expr
      case symbol_kind::S_unary_expr: // unary_expr
      case symbol_kind::S_postfix_expr: // postfix_expr
      case symbol_kind::S_primary_expr: // primary_expr
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_for_statement: // for_statement
      case symbol_kind::S_while_statement: // while_statement
      case symbol_kind::S_repeat_statement: // repeat_statement
        value.move< ast_item_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_43_statement_list_: // "statement list"
      case symbol_kind::S_statement_list: // statement_list
        value.move< ast_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_NUMBER: // "number"
        value.move< double > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "identifier"
      case symbol_kind::S_CMP_OPERATOR: // CMP_OPERATOR
        value.move< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

    // that is emptied.
    that.kind_ = symbol_kind::S_YYEMPTY;
  }